

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Enumerant * __thiscall
capnp::EnumSchema::getEnumerantByName
          (Enumerant *__return_storage_ptr__,EnumSchema *this,StringPtr name)

{
  NullableValue<capnp::EnumSchema::Enumerant> *other;
  Enumerant *pEVar1;
  Fault local_e8;
  Fault f;
  Enumerant *enumerant;
  Maybe<capnp::EnumSchema::Enumerant> local_b0;
  undefined1 local_68 [8];
  NullableValue<capnp::EnumSchema::Enumerant> _enumerant563;
  EnumSchema *this_local;
  StringPtr name_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  this_local = (EnumSchema *)name.content.ptr;
  _enumerant563.field_1._56_8_ = this;
  findEnumerantByName(&local_b0,this,name);
  other = kj::_::readMaybe<capnp::EnumSchema::Enumerant>(&local_b0);
  kj::_::NullableValue<capnp::EnumSchema::Enumerant>::NullableValue
            ((NullableValue<capnp::EnumSchema::Enumerant> *)local_68,other);
  kj::Maybe<capnp::EnumSchema::Enumerant>::~Maybe(&local_b0);
  pEVar1 = kj::_::NullableValue::operator_cast_to_Enumerant_((NullableValue *)local_68);
  if (pEVar1 != (Enumerant *)0x0) {
    f.exception = (Exception *)
                  kj::_::NullableValue<capnp::EnumSchema::Enumerant>::operator*
                            ((NullableValue<capnp::EnumSchema::Enumerant> *)local_68);
    memcpy(__return_storage_ptr__,f.exception,0x40);
    kj::_::NullableValue<capnp::EnumSchema::Enumerant>::~NullableValue
              ((NullableValue<capnp::EnumSchema::Enumerant> *)local_68);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27],kj::StringPtr&>
            (&local_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
             ,0x236,FAILED,(char *)0x0,"\"enum has no such enumerant\", name",
             (char (*) [27])"enum has no such enumerant",(StringPtr *)&this_local);
  kj::_::Debug::Fault::fatal(&local_e8);
}

Assistant:

EnumSchema::Enumerant EnumSchema::getEnumerantByName(kj::StringPtr name) const {
  KJ_IF_SOME(enumerant, findEnumerantByName(name)) {
    return enumerant;
  } else {
    KJ_FAIL_REQUIRE("enum has no such enumerant", name);
  }
}